

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O2

ze_result_t
tracing_layer::zeDeviceGetCacheProperties
          (ze_device_handle_t hDevice,uint32_t *pCount,
          ze_device_cache_properties_t *pCacheProperties)

{
  ulong uVar1;
  _func__ze_result_t__ze_device_handle_t_ptr_uint_ptr__ze_device_cache_properties_t_ptr *zeApiPtr;
  _ze_result_t _Var2;
  ze_result_t zVar3;
  char *pcVar4;
  undefined1 *puVar5;
  ulong *puVar6;
  _func_void__ze_device_get_cache_properties_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr *p_Var7
  ;
  long lVar8;
  size_t i;
  ulong uVar9;
  ze_device_cache_properties_t *pCacheProperties_local;
  uint32_t *pCount_local;
  ze_device_handle_t hDevice_local;
  APITracerCallbackDataImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_78;
  _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_60;
  ze_device_get_cache_properties_params_t tracerParams;
  
  if (DAT_00189278 ==
      (_func__ze_result_t__ze_device_handle_t_ptr_uint_ptr__ze_device_cache_properties_t_ptr *)0x0)
  {
    zVar3 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    pCacheProperties_local = pCacheProperties;
    pCount_local = pCount;
    hDevice_local = hDevice;
    pcVar4 = (char *)tracingInProgress();
    if (*pcVar4 != '\0') {
      _Var2 = (*DAT_00189278)(hDevice,pCount,pCacheProperties);
      return _Var2;
    }
    puVar5 = (undefined1 *)tracingInProgress();
    *puVar5 = 1;
    tracerParams.phDevice = &hDevice_local;
    tracerParams.ppCount = &pCount_local;
    tracerParams.ppCacheProperties = &pCacheProperties_local;
    apiCallbackData.epilogCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    apiCallbackData.epilogCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    apiCallbackData.prologCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    apiCallbackData.prologCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    apiCallbackData.epilogCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    apiCallbackData.apiOrdinal =
         (_func_void__ze_device_get_cache_properties_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
          *)0x0;
    apiCallbackData.prologCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    puVar6 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
    if (puVar6 == (ulong *)0x0) {
      p_Var7 = (_func_void__ze_device_get_cache_properties_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                *)0x0;
    }
    else {
      lVar8 = 0xcb0;
      for (uVar9 = 0; p_Var7 = apiCallbackData.apiOrdinal, uVar9 < *puVar6; uVar9 = uVar9 + 1) {
        uVar1 = puVar6[1];
        prologCallback.current_api_callback =
             *(_func_void__ze_device_get_cache_properties_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
               **)((uVar1 - 0xb90) + lVar8);
        p_Var7 = *(_func_void__ze_device_get_cache_properties_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                   **)((uVar1 - 0x538) + lVar8);
        prologCallback.pUserData = *(void **)(uVar1 + lVar8);
        std::
        vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ::push_back(&apiCallbackData.prologCallbacks,&prologCallback);
        epilogCallback.pUserData = *(void **)(puVar6[1] + lVar8);
        epilogCallback.current_api_callback = p_Var7;
        std::
        vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ::push_back(&apiCallbackData.epilogCallbacks,&epilogCallback);
        lVar8 = lVar8 + 0xcb8;
      }
    }
    zeApiPtr = DAT_00189278;
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              *)&local_60,&apiCallbackData.prologCallbacks);
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              *)&local_78,&apiCallbackData.epilogCallbacks);
    zVar3 = APITracerWrapperImp<_ze_result_t(*)(_ze_device_handle_t*,unsigned_int*,_ze_device_cache_properties_t*),_ze_device_get_cache_properties_params_t*,void(*)(_ze_device_get_cache_properties_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_device_get_cache_properties_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_device_get_cache_properties_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_device_get_cache_properties_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_device_get_cache_properties_params_t*,_ze_result_t,void*,void**)>>>,_ze_device_handle_t*&,unsigned_int*&,_ze_device_cache_properties_t*&>
                      (zeApiPtr,&tracerParams,p_Var7,
                       (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        *)&local_60,
                       (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        *)&local_78,&hDevice_local,&pCount_local,&pCacheProperties_local);
    std::
    _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::~_Vector_base(&local_78);
    std::
    _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::~_Vector_base(&local_60);
    APITracerCallbackDataImp<void_(*)(_ze_device_get_cache_properties_params_t_*,__ze_result_t,_void_*,_void_**)>
    ::~APITracerCallbackDataImp(&apiCallbackData);
  }
  return zVar3;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceGetCacheProperties(
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        uint32_t* pCount,                               ///< [in,out] pointer to the number of cache properties.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of cache properties available.
                                                        ///< if count is greater than the number of cache properties available,
                                                        ///< then the driver shall update the value with the correct number of
                                                        ///< cache properties available.
        ze_device_cache_properties_t* pCacheProperties  ///< [in,out][optional][range(0, *pCount)] array of query results for cache properties.
                                                        ///< if count is less than the number of cache properties available, then
                                                        ///< driver shall only retrieve that number of cache properties.
        )
    {
        auto pfnGetCacheProperties = context.zeDdiTable.Device.pfnGetCacheProperties;

        if( nullptr == pfnGetCacheProperties)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.Device.pfnGetCacheProperties, hDevice, pCount, pCacheProperties);

        // capture parameters
        ze_device_get_cache_properties_params_t tracerParams = {
            &hDevice,
            &pCount,
            &pCacheProperties
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnDeviceGetCachePropertiesCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnDeviceGetCachePropertiesCb_t, Device, pfnGetCachePropertiesCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.Device.pfnGetCacheProperties,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phDevice,
                                                  *tracerParams.ppCount,
                                                  *tracerParams.ppCacheProperties);
    }